

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::DoTrackMergedValueForKills
          (GlobOpt *this,Value *value,GlobOptBlockData *blockData,
          BVSparse<Memory::JitArenaAllocator> *mergedValueTypesTrackedForKills)

{
  ValueType *this_00;
  ValueInfo *valueInfo;
  code *pcVar1;
  Value *this_01;
  bool bVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  ArrayValueInfo *pAVar6;
  Value *local_50;
  Value *value_local;
  GlobOpt *local_40;
  GlobOptBlockData *local_38;
  
  local_50 = value;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d3,"(value)","value");
    if (!bVar2) goto LAB_0043ec8d;
    *puVar5 = 0;
  }
  if (blockData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d4,"(blockData)","blockData");
    if (!bVar2) goto LAB_0043ec8d;
    *puVar5 = 0;
  }
  valueInfo = value->valueInfo;
  this_00 = &valueInfo->super_ValueType;
  value_local = (Value *)mergedValueTypesTrackedForKills;
  local_40 = this;
  bVar2 = ValueType::IsAnyOptimizedArray(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d7,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar2) goto LAB_0043ec8d;
    *puVar5 = 0;
  }
  bVar2 = ValueType::IsArrayOrObjectWithArray(this_00);
  bVar3 = ValueType::IsOptimizedTypedArray(this_00);
  if (bVar2 == bVar3) {
    AssertCount = AssertCount + 1;
    local_38 = blockData;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32da,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar3) {
LAB_0043ec8d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    blockData = local_38;
  }
  bVar3 = ValueType::IsOptimizedVirtualTypedArray(this_00);
  VerifyArrayValueInfoForTracking(local_40,valueInfo,bVar2,local_40->currentBlock,true);
  this_01 = value_local;
  if (!bVar3 && !bVar2) {
    bVar2 = ValueInfo::IsArrayValueInfo(valueInfo);
    if (!bVar2) {
      return;
    }
    pAVar6 = ValueInfo::AsArrayValueInfo(valueInfo);
    if (pAVar6->headSegmentLengthSym == (StackSym *)0x0) {
      return;
    }
  }
  if ((this_01 != (Value *)0x0) &&
     (BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                        ((BVSparse<Memory::JitArenaAllocator> *)this_01,value->valueNumber),
     BVar4 != '\0')) {
    return;
  }
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Add(blockData->valuesToKillOnCalls,&local_50);
  return;
}

Assistant:

void
GlobOpt::DoTrackMergedValueForKills(
    Value *const value,
    GlobOptBlockData *const blockData,
    BVSparse<JitArenaAllocator> *const mergedValueTypesTrackedForKills) const
{
    Assert(value);
    Assert(blockData);

    ValueInfo *valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsAnyOptimizedArray());

    const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

    const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

#if DBG
    VerifyArrayValueInfoForTracking(valueInfo, isJsArray, currentBlock, true);
#endif

    if(!isJsArray && !isVirtualTypedArray && !(valueInfo->IsArrayValueInfo() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()))
    {
        return;
    }

    // Can't assume going forward that it will definitely be an array without disabling implicit calls, because the
    // array may be transformed into an ES5 array. Since array opts are enabled, implicit calls can be disabled, and we can
    // treat it as a definite value type going forward, but the value needs to be tracked so that something like a call can
    // revert the value type to a likely version.
    if(!mergedValueTypesTrackedForKills || !mergedValueTypesTrackedForKills->TestAndSet(value->GetValueNumber()))
    {
        blockData->valuesToKillOnCalls->Add(value);
    }
}